

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# non_linear_least_squares.cpp
# Opt level: O0

int __thiscall
SubstrateConcentrationFunctor::operator()
          (SubstrateConcentrationFunctor *this,VectorXd *z,VectorXd *r)

{
  ulong uVar1;
  Index IVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  double dVar5;
  ConstRowXpr local_b8;
  ConstRowXpr local_80;
  uint local_44;
  double dStack_40;
  uint i;
  double beta2;
  double beta1;
  double y_i;
  double x_i;
  VectorXd *r_local;
  VectorXd *z_local;
  SubstrateConcentrationFunctor *this_local;
  
  local_44 = 0;
  x_i = (double)r;
  r_local = z;
  z_local = (VectorXd *)this;
  while( true ) {
    uVar1 = (ulong)local_44;
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&(this->Points).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar2 <= (long)uVar1) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_80,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Points,
               (ulong)local_44);
    beta1 = Eigen::
            DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>
            ::operator()((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                          *)&local_80,1);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_b8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->Points,
               (ulong)local_44);
    y_i = Eigen::
          DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>,_0>
          ::operator()((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                        *)&local_b8,0);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)r_local,0);
    beta2 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)r_local,1);
    dStack_40 = *pdVar3;
    dVar5 = beta1 - (beta2 * y_i) / (dStack_40 + y_i);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)x_i,
                        (ulong)local_44);
    *pSVar4 = dVar5;
    local_44 = local_44 + 1;
  }
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &z, Eigen::VectorXd &r) const
    {
        double x_i,y_i,beta1,beta2;
        for(unsigned int i = 0; i < this->Points.rows(); ++i)
        {
            y_i=this->Points.row(i)(1);
            x_i=this->Points.row(i)(0);
            beta1=z(0);
            beta2=z(1);
            r(i) =y_i-(beta1*x_i) /(beta2+x_i);
        }

        return 0;
    }